

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

void __thiscall cppnet::Address::SetIp(Address *this,string *ip)

{
  string local_30;
  
  if (this->_address_type == AT_IPV6) {
    ToIpv6(&local_30,(Address *)ip,ip);
  }
  else {
    ToIpv4(&local_30,(Address *)ip,ip);
  }
  std::__cxx11::string::operator=((string *)&this->_ip,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Address::SetIp(const std::string& ip) {
    if (_address_type == AT_IPV6) {
        _ip = ToIpv6(ip);
    
    } else {
        _ip = ToIpv4(ip);
    }
}